

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O1

int luaL_newmetatable(lua_State *L,char *tname)

{
  TValue *pTVar1;
  uint64_t uVar2;
  size_t lenx;
  GCstr *key;
  TValue *pTVar3;
  GCtab *pGVar4;
  GCobj *o;
  GCtab *t;
  int iVar5;
  
  t = (GCtab *)(*(ulong *)((L->glref).ptr64 + 0x110) & 0x7fffffffffff);
  lenx = strlen(tname);
  key = lj_str_new(L,tname,lenx);
  pTVar3 = lj_tab_setstr(L,t,key);
  if (pTVar3->u64 == 0xffffffffffffffff) {
    iVar5 = 1;
    pGVar4 = lj_tab_new(L,0,1);
    pTVar3->u64 = (ulong)pGVar4 | 0xfffa000000000000;
    pTVar3 = L->top;
    L->top = pTVar3 + 1;
    pTVar3->u64 = (ulong)pGVar4 | 0xfffa000000000000;
    if ((t->marked & 4) != 0) {
      uVar2 = (L->glref).ptr64;
      t->marked = t->marked & 0xfb;
      (t->gclist).gcptr64 = *(uint64_t *)(uVar2 + 0x40);
      *(GCtab **)(uVar2 + 0x40) = t;
    }
  }
  else {
    pTVar1 = L->top;
    L->top = pTVar1 + 1;
    *pTVar1 = *pTVar3;
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

LUALIB_API int luaL_newmetatable(lua_State *L, const char *tname)
{
  GCtab *regt = tabV(registry(L));
  TValue *tv = lj_tab_setstr(L, regt, lj_str_newz(L, tname));
  if (tvisnil(tv)) {
    GCtab *mt = lj_tab_new(L, 0, 1);
    settabV(L, tv, mt);
    settabV(L, L->top++, mt);
    lj_gc_anybarriert(L, regt);
    return 1;
  } else {
    copyTV(L, L->top++, tv);
    return 0;
  }
}